

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

char * jsonnet_realloc(JsonnetVm *vm,char *str,size_t sz)

{
  char *pcVar1;
  char *extraout_RDX;
  
  if (str != (char *)0x0) {
    if (sz == 0) goto LAB_00148c8a;
    pcVar1 = (char *)realloc(str,sz);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    jsonnet_realloc_cold_1();
    sz = (size_t)extraout_RDX;
  }
  if ((char *)sz == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = (char *)malloc(sz);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  jsonnet_realloc_cold_2();
  str = (char *)sz;
LAB_00148c8a:
  free(str);
  return (char *)0x0;
}

Assistant:

char *jsonnet_realloc(JsonnetVm *vm, char *str, size_t sz)
{
    (void)vm;
    if (str == nullptr) {
        if (sz == 0)
            return nullptr;
        auto *r = static_cast<char *>(::malloc(sz));
        if (r == nullptr)
            memory_panic();
        return r;
    } else {
        if (sz == 0) {
            ::free(str);
            return nullptr;
        } else {
            auto *r = static_cast<char *>(::realloc(str, sz));
            if (r == nullptr)
                memory_panic();
            return r;
        }
    }
}